

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_geometry.cpp
# Opt level: O0

bool __thiscall ON_Geometry::Scale(ON_Geometry *this,double x)

{
  uint uVar1;
  bool local_a9;
  undefined1 local_a0 [8];
  ON_Xform s;
  double x_local;
  ON_Geometry *this_local;
  
  if ((x != 1.0) || (NAN(x))) {
    local_a9 = -1.23432101234321e+308 < x && x < 1.23432101234321e+308;
    if (local_a9) {
      s.m_xform[3][3] = x;
      ON_Xform::DiagonalTransformation((ON_Xform *)local_a0,x);
      uVar1 = (*(this->super_ON_Object)._vptr_ON_Object[0x1c])(this,local_a0);
      this_local._7_1_ = (uVar1 & 1) != 0;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Geometry::Scale( double x )
{
  if ( x == 1.0 )
    return true;
  if (false == ON_IS_VALID(x))
    return false;
  ON_Xform s(ON_Xform::DiagonalTransformation(x));
  return (0!=Transform( s ));
}